

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

pair<QEventPoint::State,_QList<QEventPoint>_> * __thiscall
QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::operator[]
          (QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_> *this,QWidget **key
          )

{
  long in_FS_OFFSET;
  TryEmplaceResult local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QWidget*,std::pair<QEventPoint::State,QList<QEventPoint>>>::tryEmplace_impl<QWidget*const&>
            (&local_28,this,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (pair<QEventPoint::State,_QList<QEventPoint>_> *)
           ((local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].entries
            [(local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].offsets
             [(uint)local_28.iterator.i.bucket & 0x7f]].storage.data + 8);
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }